

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O2

string * __thiscall Node::getProdecessor_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  allocator<char> local_59;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->_prodecessor)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"-",&local_59);
  }
  else {
    __first = std::next<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                        ((this->_prodecessor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,1
                        );
    std::__cxx11::string::string
              ((string *)&local_38,
               (string *)
               ((this->_prodecessor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::function(&local_58,&this->_joinFunction);
    std::
    accumulate<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::__cxx11::string,std::function<std::__cxx11::string(std::__cxx11::string,std::__cxx11::string)>>
              (__return_storage_ptr__,__first,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(this->_prodecessor)._M_t._M_impl.super__Rb_tree_header,&local_38,&local_58);
    std::_Function_base::~_Function_base(&local_58.super__Function_base);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

string getProdecessor() {
    if (!this->_prodecessor.size()) {
      return "-";
    }

    return accumulate(next(this->_prodecessor.begin()), this->_prodecessor.end(), move(*this->_prodecessor.begin()), this->_joinFunction);
  }